

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void update_slots(EOPLL *opll)

{
  EOPLL_SLOT *slot_00;
  EOPLL_SLOT *local_28;
  EOPLL_SLOT *buddy;
  EOPLL_SLOT *slot;
  int i;
  EOPLL *opll_local;
  
  opll->eg_counter = opll->eg_counter + 1;
  for (slot._4_4_ = 0; slot._4_4_ < 0x12; slot._4_4_ = slot._4_4_ + 1) {
    slot_00 = opll->slot + slot._4_4_;
    local_28 = (EOPLL_SLOT *)0x0;
    if (slot_00->type == '\0') {
      local_28 = opll->slot + (slot._4_4_ + 1);
    }
    if (slot_00->type == '\x01') {
      local_28 = opll->slot + (slot._4_4_ + -1);
    }
    if (slot_00->update_requests != 0) {
      commit_slot_update(slot_00);
    }
    calc_envelope(slot_00,local_28,(uint16_t)opll->eg_counter,opll->test_flag & 1);
    calc_phase(slot_00,opll->pm_phase,opll->test_flag & 4);
  }
  return;
}

Assistant:

static void update_slots(EOPLL *opll) {
  int i;
  opll->eg_counter++;

  for (i = 0; i < 18; i++) {
    EOPLL_SLOT *slot = &opll->slot[i];
    EOPLL_SLOT *buddy = NULL;
    if (slot->type == 0) {
      buddy = &opll->slot[i + 1];
    }
    if (slot->type == 1) {
      buddy = &opll->slot[i - 1];
    }
    if (slot->update_requests) {
      commit_slot_update(slot);
    }
    calc_envelope(slot, buddy, opll->eg_counter, opll->test_flag & 1);
    calc_phase(slot, opll->pm_phase, opll->test_flag & 4);
  }
}